

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O1

void __thiscall xLearn::Model::initial(Model *this,bool set_val)

{
  int iVar1;
  real_t *prVar2;
  ostream *poVar3;
  Logger local_74;
  string local_70;
  string local_50;
  
  prVar2 = (real_t *)malloc((ulong)this->param_num_w_ << 2);
  this->param_w_ = prVar2;
  prVar2 = (real_t *)malloc((ulong)this->aux_size_ << 2);
  this->param_b_ = prVar2;
  iVar1 = std::__cxx11::string::compare((char *)this);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)this);
    if (iVar1 != 0) {
      this->param_v_ = (real_t *)0x0;
      goto LAB_0011d0d0;
    }
  }
  iVar1 = posix_memalign(&this->param_v_,0x10,(ulong)this->param_num_v_ << 2);
  if (iVar1 != 0) {
    local_74.severity_ = ERR;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters.cc"
               ,"");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"initial","");
    poVar3 = Logger::Start(ERR,&local_50,99,&local_70);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"CHECK_EQ failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters.cc"
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,99);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"ret",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    Logger::~Logger(&local_74);
    abort();
  }
LAB_0011d0d0:
  if (set_val) {
    set_value(this);
  }
  return;
}

Assistant:

void Model::initial(bool set_val) {
  try {
    // Conventional malloc for linear term and bias
    param_w_ = (real_t*)malloc(param_num_w_ * sizeof(real_t));
    param_b_ = (real_t*)malloc(aux_size_ * sizeof(real_t));
    if (score_func_.compare("fm") == 0 ||
        score_func_.compare("ffm") == 0) {
      // Aligned malloc for latent factor
#ifdef _MSC_VER
      param_v_ = (decltype(param_v_))_aligned_malloc(
                 param_num_v_ * sizeof(real_t),
                 kAlignByte);
#else
      int ret = posix_memalign(
                (void**)&param_v_,
                kAlignByte,
                param_num_v_ * sizeof(real_t));
      CHECK_EQ(ret, 0);
#endif
    } else {
      param_v_ = nullptr;
    }
  } catch (std::bad_alloc&) {
    LOG(FATAL) << "Cannot allocate enough memory for current  \
                   model parameters. Parameter size: "
               << GetNumParameter();
  }
  // Set value for model
  if (set_val) {
    set_value();
  }
}